

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac_legacy_sig.c
# Opt level: O0

void * mac_dupctx(void *vpmacctx)

{
  int iVar1;
  undefined8 *vpmacctx_00;
  char *pcVar2;
  EVP_MAC_CTX *pEVar3;
  char *in_RDI;
  PROV_MAC_CTX *dstctx;
  PROV_MAC_CTX *srcctx;
  MAC_KEY *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  int line;
  
  line = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  pcVar2 = in_RDI;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    return (void *)0x0;
  }
  vpmacctx_00 = (undefined8 *)CRYPTO_zalloc((size_t)pcVar2,in_RDI,line);
  if (vpmacctx_00 == (undefined8 *)0x0) {
    return (void *)0x0;
  }
  *vpmacctx_00 = *(undefined8 *)in_RDI;
  vpmacctx_00[1] = *(undefined8 *)(in_RDI + 8);
  vpmacctx_00[2] = *(undefined8 *)(in_RDI + 0x10);
  vpmacctx_00[3] = *(undefined8 *)(in_RDI + 0x18);
  vpmacctx_00[1] = 0;
  vpmacctx_00[2] = 0;
  vpmacctx_00[3] = 0;
  if (*(long *)(in_RDI + 8) != 0) {
    pcVar2 = CRYPTO_strdup(*(char **)(in_RDI + 8),
                           "providers/implementations/signature/mac_legacy_sig.c",0xbf);
    vpmacctx_00[1] = pcVar2;
    if (pcVar2 == (char *)0x0) goto LAB_00346e77;
  }
  if ((*(long *)(in_RDI + 0x10) == 0) ||
     (iVar1 = ossl_mac_key_up_ref(in_stack_ffffffffffffffd8), iVar1 != 0)) {
    vpmacctx_00[2] = *(undefined8 *)(in_RDI + 0x10);
    if (*(long *)(in_RDI + 0x18) == 0) {
      return vpmacctx_00;
    }
    pEVar3 = EVP_MAC_CTX_dup((EVP_MAC_CTX *)in_stack_ffffffffffffffd8);
    vpmacctx_00[3] = pEVar3;
    if (vpmacctx_00[3] != 0) {
      return vpmacctx_00;
    }
  }
LAB_00346e77:
  mac_freectx(vpmacctx_00);
  return (void *)0x0;
}

Assistant:

static void *mac_dupctx(void *vpmacctx)
{
    PROV_MAC_CTX *srcctx = (PROV_MAC_CTX *)vpmacctx;
    PROV_MAC_CTX *dstctx;

    if (!ossl_prov_is_running())
        return NULL;

    dstctx = OPENSSL_zalloc(sizeof(*srcctx));
    if (dstctx == NULL)
        return NULL;

    *dstctx = *srcctx;
    dstctx->propq = NULL;
    dstctx->key = NULL;
    dstctx->macctx = NULL;

    if (srcctx->propq != NULL && (dstctx->propq = OPENSSL_strdup(srcctx->propq)) == NULL)
        goto err;

    if (srcctx->key != NULL && !ossl_mac_key_up_ref(srcctx->key))
        goto err;
    dstctx->key = srcctx->key;

    if (srcctx->macctx != NULL) {
        dstctx->macctx = EVP_MAC_CTX_dup(srcctx->macctx);
        if (dstctx->macctx == NULL)
            goto err;
    }

    return dstctx;
 err:
    mac_freectx(dstctx);
    return NULL;
}